

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeTypedArrayPrototype
               (DynamicObject *typedarrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  JavascriptFunction *pJVar3;
  undefined4 *puVar4;
  
  DeferredTypeHandlerBase::Convert(typeHandler,typedarrayPrototype,mode,0x1f,0);
  this = (((typedarrayPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this_00);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,this_00);
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x67,(this->super_JavascriptLibraryBase).typedArrayConstructor.ptr,
             6,0,0,0);
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x19b,(FunctionInfo *)TypedArrayBase::EntryInfo::Set,2,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x1cb,(FunctionInfo *)TypedArrayBase::EntryInfo::Subarray,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x51,(FunctionInfo *)TypedArrayBase::EntryInfo::At,1,'\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,99,(FunctionInfo *)TypedArrayBase::EntryInfo::CopyWithin,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x82,(FunctionInfo *)TypedArrayBase::EntryInfo::Every,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x88,(FunctionInfo *)TypedArrayBase::EntryInfo::Fill,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x89,(FunctionInfo *)TypedArrayBase::EntryInfo::Filter,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x8b,(FunctionInfo *)TypedArrayBase::EntryInfo::Find,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x8c,(FunctionInfo *)TypedArrayBase::EntryInfo::FindIndex,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x93,(FunctionInfo *)TypedArrayBase::EntryInfo::ForEach,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xb9,(FunctionInfo *)TypedArrayBase::EntryInfo::IndexOf,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xcc,(FunctionInfo *)TypedArrayBase::EntryInfo::Join,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xd0,(FunctionInfo *)TypedArrayBase::EntryInfo::LastIndexOf,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xd5,(FunctionInfo *)TypedArrayBase::EntryInfo::Map,1,'\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,300,(FunctionInfo *)TypedArrayBase::EntryInfo::Reduce,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x12d,(FunctionInfo *)TypedArrayBase::EntryInfo::ReduceRight,1
             ,'\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x136,(FunctionInfo *)TypedArrayBase::EntryInfo::Reverse,0,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x150,(FunctionInfo *)TypedArrayBase::EntryInfo::Slice,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x151,(FunctionInfo *)TypedArrayBase::EntryInfo::Some,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x152,(FunctionInfo *)TypedArrayBase::EntryInfo::Sort,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0x7a,(FunctionInfo *)TypedArrayBase::EntryInfo::Entries,0,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xcf,(FunctionInfo *)TypedArrayBase::EntryInfo::Keys,0,'\x06')
  ;
  pJVar3 = AddFunctionToLibraryObject
                     (this,typedarrayPrototype,399,(FunctionInfo *)TypedArrayBase::EntryInfo::Values
                      ,0,'\x06');
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x14,pJVar3,6,0,0,0);
  AddFunctionToLibraryObject
            (this,typedarrayPrototype,0xb8,(FunctionInfo *)TypedArrayBase::EntryInfo::Includes,1,
             '\x06');
  AddAccessorsToLibraryObject
            (this,typedarrayPrototype,0x1aa,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterBuffer,
             (FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this,typedarrayPrototype,0x1a9,
             (FunctionInfo *)TypedArrayBase::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this,typedarrayPrototype,0x1a8,
             (FunctionInfo *)TypedArrayBase::EntryInfo::GetterByteOffset,(FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this,typedarrayPrototype,0xd1,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterLength,
             (FunctionInfo *)0x0);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    AddAccessorsToLibraryObjectWithName
              (this,typedarrayPrototype,0x1b,0x2c3,
               (FunctionInfo *)TypedArrayBase::EntryInfo::GetterSymbolToStringTag,
               (FunctionInfo *)0x0);
  }
  pJVar3 = (this->arrayPrototypeToLocaleStringFunction).ptr;
  if ((this->arrayPrototypeToStringFunction).ptr == (JavascriptFunction *)0x0) {
    if (pJVar3 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x95a,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) goto LAB_00a99872;
      *puVar4 = 0;
    }
    pJVar3 = AddFunctionToLibraryObject
                       (this,typedarrayPrototype,0x172,
                        (FunctionInfo *)JavascriptArray::EntryInfo::ToLocaleString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              (&this->arrayPrototypeToLocaleStringFunction,pJVar3);
    pJVar3 = AddFunctionToLibraryObject
                       (this,typedarrayPrototype,0x178,
                        (FunctionInfo *)JavascriptArray::EntryInfo::ToString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              (&this->arrayPrototypeToStringFunction,pJVar3);
  }
  else {
    if (pJVar3 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x961,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
LAB_00a99872:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pJVar3 = (this->arrayPrototypeToLocaleStringFunction).ptr;
    }
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x172,pJVar3,6,0,0,0);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x178,(this->arrayPrototypeToStringFunction).ptr,6,0,0,0);
  }
  if (((this_00->config).threadConfig)->m_ESArrayFindFromLast == true) {
    AddFunctionToLibraryObject
              (this,typedarrayPrototype,0x8d,(FunctionInfo *)TypedArrayBase::EntryInfo::FindLast,1,
               '\x06');
    AddFunctionToLibraryObject
              (this,typedarrayPrototype,0x8e,
               (FunctionInfo *)TypedArrayBase::EntryInfo::FindLastIndex,1,'\x06');
  }
  DynamicObject::SetHasNoEnumerableProperties(typedarrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayPrototype(DynamicObject* typedarrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedarrayPrototype, mode, 31);

        ScriptContext* scriptContext = typedarrayPrototype->GetScriptContext();
        JavascriptLibrary* library = typedarrayPrototype->GetLibrary();

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
#endif

        library->AddMember(typedarrayPrototype, PropertyIds::constructor, library->typedArrayConstructor);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::set, &TypedArrayBase::EntryInfo::Set, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::subarray, &TypedArrayBase::EntryInfo::Subarray, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::at, &TypedArrayBase::EntryInfo::At, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::copyWithin, &TypedArrayBase::EntryInfo::CopyWithin, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::every, &TypedArrayBase::EntryInfo::Every, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::fill, &TypedArrayBase::EntryInfo::Fill, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::filter, &TypedArrayBase::EntryInfo::Filter, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::find, &TypedArrayBase::EntryInfo::Find, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findIndex, &TypedArrayBase::EntryInfo::FindIndex, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::forEach, &TypedArrayBase::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::indexOf, &TypedArrayBase::EntryInfo::IndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::join, &TypedArrayBase::EntryInfo::Join, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::lastIndexOf, &TypedArrayBase::EntryInfo::LastIndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::map, &TypedArrayBase::EntryInfo::Map, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduce, &TypedArrayBase::EntryInfo::Reduce, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduceRight, &TypedArrayBase::EntryInfo::ReduceRight, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reverse, &TypedArrayBase::EntryInfo::Reverse, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::slice, &TypedArrayBase::EntryInfo::Slice, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::some, &TypedArrayBase::EntryInfo::Some, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::sort, &TypedArrayBase::EntryInfo::Sort, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::entries, &TypedArrayBase::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::keys, &TypedArrayBase::EntryInfo::Keys, 0);
        JavascriptFunction* valuesFunc = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::values, &TypedArrayBase::EntryInfo::Values, 0);
        library->AddMember(typedarrayPrototype, PropertyIds::_symbolIterator, valuesFunc);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::includes, &TypedArrayBase::EntryInfo::Includes, 1);

        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::buffer, &TypedArrayBase::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteLength, &TypedArrayBase::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteOffset, &TypedArrayBase::EntryInfo::GetterByteOffset, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::length, &TypedArrayBase::EntryInfo::GetterLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            // ES2017 22.2.3.32 get %TypedArray%.prototype[@@toStringTag]
            // %TypedArray%.prototype[@@toStringTag] is an accessor property whose set accessor function is undefined.
            // This property has the attributes { [[Enumerable]]: false, [[Configurable]]: true }.
            // The initial value of the name property of this function is "get [Symbol.toStringTag]".
            library->AddAccessorsToLibraryObjectWithName(typedarrayPrototype, PropertyIds::_symbolToStringTag,
                PropertyIds::_RuntimeFunctionNameId_toStringTag, &TypedArrayBase::EntryInfo::GetterSymbolToStringTag, nullptr);
        }
        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(typedarrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(typedarrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled()) {
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLast, &TypedArrayBase::EntryInfo::FindLast, 1);
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLastIndex, &TypedArrayBase::EntryInfo::FindLastIndex, 1);
        }

        typedarrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }